

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O0

DistantLight *
pbrt::DistantLight::Create
          (Transform *renderFromLight,ParameterDictionary *parameters,RGBColorSpace *colorSpace,
          FileLoc *loc,Allocator alloc)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  Allocator alloc_00;
  DistantLight *pDVar3;
  Transform *in_RSI;
  undefined8 in_R8;
  Float FVar4;
  undefined8 uVar7;
  Transform *this;
  undefined1 extraout_var [56];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  Point3f PVar9;
  Tuple3<pbrt::Point3,_float> TVar10;
  Vector3<float> VVar11;
  Float k_e;
  Float E_v;
  Transform finalRenderFromLight;
  Transform t;
  Float m [4] [4];
  Vector3f v2;
  Vector3f v1;
  Vector3f w;
  Point3f to;
  Point3f from;
  Float sc;
  SpectrumHandle L;
  float in_stack_fffffffffffffc38;
  float in_stack_fffffffffffffc3c;
  ParameterDictionary *in_stack_fffffffffffffc40;
  ParameterDictionary *this_00;
  Point3<float> *in_stack_fffffffffffffc48;
  float *args_2;
  Point3<float> *in_stack_fffffffffffffc50;
  SpectrumHandle *s;
  Transform *pTVar12;
  Vector3<float> *in_stack_fffffffffffffc60;
  Vector3<float> *in_stack_fffffffffffffc68;
  undefined4 in_stack_fffffffffffffc70;
  undefined4 in_stack_fffffffffffffc74;
  string *in_stack_fffffffffffffc78;
  ParameterDictionary *in_stack_fffffffffffffc80;
  SpectrumType in_stack_fffffffffffffcac;
  SpectrumHandle *in_stack_fffffffffffffcb0;
  string *in_stack_fffffffffffffcb8;
  ParameterDictionary *in_stack_fffffffffffffcc0;
  undefined4 in_stack_fffffffffffffcc8;
  undefined4 in_stack_fffffffffffffccc;
  allocator<char> local_309;
  string local_308 [36];
  float local_2e4;
  Transform local_2e0;
  SpectrumHandle local_258 [16];
  undefined4 local_1d8;
  float local_1d4;
  undefined4 local_1d0;
  undefined4 local_1cc;
  undefined4 local_1c8;
  undefined4 local_1c4;
  undefined4 local_1c0;
  undefined4 local_1bc;
  undefined4 local_1b8;
  undefined4 local_1b4;
  float local_1b0;
  undefined4 local_1ac;
  undefined4 local_1a8;
  undefined4 local_1a4;
  undefined4 local_1a0;
  undefined4 local_19c;
  float local_198;
  undefined4 local_194;
  undefined4 local_190;
  undefined1 local_18c [107];
  allocator<char> local_121;
  string local_120 [40];
  float local_f8;
  undefined8 local_f0;
  float local_e8;
  allocator<char> local_d1;
  string local_d0 [32];
  undefined8 local_b0;
  float local_a8;
  allocator<char> local_a1;
  string local_a0 [36];
  Float local_7c;
  undefined8 local_78;
  allocator<char> local_51;
  string local_50 [56];
  Transform *local_18;
  undefined8 local_8;
  undefined1 auVar8 [56];
  
  local_18 = in_RSI;
  local_8 = in_R8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffc80,(char *)in_stack_fffffffffffffc78,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
  SpectrumHandle::TaggedPointer<pbrt::DenselySampledSpectrum_const>
            ((SpectrumHandle *)in_stack_fffffffffffffc40,
             (DenselySampledSpectrum *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38)
            );
  local_78 = local_8;
  alloc_00.memoryResource._4_4_ = in_stack_fffffffffffffccc;
  alloc_00.memoryResource._0_4_ = in_stack_fffffffffffffcc8;
  ParameterDictionary::GetOneSpectrum
            (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,
             in_stack_fffffffffffffcac,alloc_00);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_51);
  pTVar12 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffc80,(char *)in_stack_fffffffffffffc78,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
  FVar4 = ParameterDictionary::GetOneFloat
                    (in_stack_fffffffffffffc40,
                     (string *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),0.0);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator(&local_a1);
  local_7c = FVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffc80,(char *)in_stack_fffffffffffffc78,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
  uVar7 = 0;
  Point3<float>::Point3
            ((Point3<float> *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc3c,
             in_stack_fffffffffffffc38,0.0);
  PVar9 = ParameterDictionary::GetOnePoint3f
                    (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,
                     (Point3f *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
  local_e8 = PVar9.super_Tuple3<pbrt::Point3,_float>.z;
  auVar2._8_8_ = uVar7;
  auVar2._0_8_ = PVar9.super_Tuple3<pbrt::Point3,_float>._0_8_;
  local_f0 = vmovlpd_avx(auVar2);
  local_b0 = local_f0;
  local_a8 = local_e8;
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator(&local_d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffc80,(char *)in_stack_fffffffffffffc78,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
  this = (Transform *)0x0;
  Point3<float>::Point3
            ((Point3<float> *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc3c,
             in_stack_fffffffffffffc38,0.0);
  TVar10 = (Tuple3<pbrt::Point3,_float>)
           ParameterDictionary::GetOnePoint3f
                     (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,
                      (Point3f *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
  local_18c._84_4_ = TVar10.z;
  auVar1._8_8_ = this;
  auVar1._0_8_ = TVar10._0_8_;
  local_18c._76_8_ = vmovlpd_avx(auVar1);
  local_120._32_8_ = local_18c._76_8_;
  local_f8 = (float)local_18c._84_4_;
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator(&local_121);
  auVar8 = extraout_var;
  VVar11 = Point3<float>::operator-(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
  local_18c._36_4_ = VVar11.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar5._0_8_ = VVar11.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar5._8_56_ = auVar8;
  local_18c._28_8_ = vmovlpd_avx(auVar5._0_16_);
  local_18c._44_8_ = local_18c._28_8_;
  local_18c._52_4_ = local_18c._36_4_;
  VVar11 = Normalize<float>(in_stack_fffffffffffffc60);
  local_18c._20_4_ = VVar11.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar6._0_8_ = VVar11.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar6._8_56_ = auVar8;
  local_18c._12_8_ = vmovlpd_avx(auVar6._0_16_);
  this_00 = (ParameterDictionary *)local_18c;
  local_18c._60_8_ = local_18c._12_8_;
  local_18c._68_4_ = local_18c._20_4_;
  Vector3<float>::Vector3((Vector3<float> *)0x6f1b0d);
  args_2 = &local_198;
  Vector3<float>::Vector3((Vector3<float> *)0x6f1b1f);
  CoordinateSystem<float>
            ((Vector3<float> *)CONCAT44(TVar10.z,in_stack_fffffffffffffc70),
             in_stack_fffffffffffffc68,in_stack_fffffffffffffc60);
  local_1d8 = local_18c._0_4_;
  local_1d4 = local_198;
  local_1d0 = local_18c._60_4_;
  local_1cc = 0;
  local_1c8 = local_18c._4_4_;
  local_1c4 = local_194;
  local_1c0 = local_18c._64_4_;
  local_1bc = 0;
  local_1b8 = local_18c._8_4_;
  local_1b4 = local_190;
  local_1b0 = (float)local_18c._68_4_;
  local_1ac = 0;
  local_1a8 = 0;
  local_1a4 = 0;
  local_1a0 = 0;
  local_19c = 0x3f800000;
  s = local_258;
  Transform::Transform(this,TVar10._0_8_);
  Transform::operator*(pTVar12,(Transform *)CONCAT44(FVar4,in_stack_fffffffffffffcc8));
  pTVar12 = &local_2e0;
  SpectrumHandle::SpectrumHandle
            ((SpectrumHandle *)this_00,
             (SpectrumHandle *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
  FVar4 = SpectrumToPhotometric(s);
  local_7c = local_7c / FVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,TVar10._0_8_,
             (allocator<char> *)CONCAT44(TVar10.z,in_stack_fffffffffffffc70));
  FVar4 = ParameterDictionary::GetOneFloat
                    (this_00,(string *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38)
                     ,0.0);
  std::__cxx11::string::~string(local_308);
  std::allocator<char>::~allocator(&local_309);
  if (0.0 < FVar4) {
    local_7c = (FVar4 / -(float)local_18c._64_4_) * local_7c;
  }
  local_2e4 = FVar4;
  pDVar3 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::DistantLight,pbrt::Transform&,pbrt::SpectrumHandle&,float&,pstd::pmr::polymorphic_allocator<std::byte>&>
                     ((polymorphic_allocator<std::byte> *)local_18,pTVar12,s,args_2,
                      (polymorphic_allocator<std::byte> *)this_00);
  return pDVar3;
}

Assistant:

DistantLight *DistantLight::Create(const Transform &renderFromLight,
                                   const ParameterDictionary &parameters,
                                   const RGBColorSpace *colorSpace, const FileLoc *loc,
                                   Allocator alloc) {
    SpectrumHandle L = parameters.GetOneSpectrum("L", &colorSpace->illuminant,
                                                 SpectrumType::General, alloc);
    Float sc = parameters.GetOneFloat("scale", 1);

    Point3f from = parameters.GetOnePoint3f("from", Point3f(0, 0, 0));
    Point3f to = parameters.GetOnePoint3f("to", Point3f(0, 0, 1));

    Vector3f w = Normalize(from - to);
    Vector3f v1, v2;
    CoordinateSystem(w, &v1, &v2);
    Float m[4][4] = {v1.x, v2.x, w.x, 0, v1.y, v2.y, w.y, 0,
                     v1.z, v2.z, w.z, 0, 0,    0,    0,   1};
    Transform t(m);
    Transform finalRenderFromLight = renderFromLight * t;

    // Scale the light spectrum to be equivalent to 1 nit
    sc /= SpectrumToPhotometric(L);

    // Adjust scale to meet target illuminance value
    // Like for IBLs we measure illuminance as incident on an upward-facing
    // patch.
    Float E_v = parameters.GetOneFloat("illuminance", -1);
    if (E_v > 0) {
        Float k_e = -w.y;
        sc *= E_v / k_e;
    }

    return alloc.new_object<DistantLight>(finalRenderFromLight, L, sc, alloc);
}